

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procfs-exepath.c
# Opt level: O1

int uv_exepath(char *buffer,size_t *size)

{
  size_t __len;
  int *piVar1;
  int iVar2;
  
  iVar2 = -0x16;
  if ((size != (size_t *)0x0 && buffer != (char *)0x0) && (iVar2 = -0x16, *size != 0)) {
    __len = *size - 1;
    if (0 < (long)__len) {
      __len = readlink("/proc/self/exe",buffer,__len);
    }
    if (__len == 0xffffffffffffffff) {
      piVar1 = __errno_location();
      iVar2 = -*piVar1;
    }
    else {
      buffer[__len] = '\0';
      *size = __len;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv_exepath(char* buffer, size_t* size) {
  ssize_t n;

  if (buffer == NULL || size == NULL || *size == 0)
    return UV_EINVAL;

  n = *size - 1;
  if (n > 0)
    n = readlink("/proc/self/exe", buffer, n);

  if (n == -1)
    return UV__ERR(errno);

  buffer[n] = '\0';
  *size = n;

  return 0;
}